

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [16];
  float *in_RDI;
  int in_R8D;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  float fVar15;
  __m128 _outp;
  __m128 _b;
  __m128 _a_128;
  int i;
  float a;
  binary_op_rpow op;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0_1;
  v4sf fx;
  v4sf tmp_1;
  v4sf y;
  v4sf z;
  v4sf tmp;
  v4sf mask;
  v4sf e;
  v4sf invalid_mask;
  v4sf one;
  v4si emm0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  int local_d54;
  float local_d50;
  undefined1 local_d49 [5];
  int local_d44;
  float *local_d40;
  undefined1 (*local_d38) [16];
  undefined1 (*local_d28) [16];
  undefined8 local_d18;
  undefined8 uStack_d10;
  float *local_d00;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_ce8;
  undefined8 *puStack_ce0;
  undefined8 *local_cd8;
  undefined1 *local_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  ulong local_ae8;
  ulong uStack_ae0;
  int local_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  int local_a98;
  int iStack_a94;
  int iStack_a90;
  int iStack_a8c;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  ulong local_8d8;
  ulong uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  ulong local_888;
  ulong uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  ulong local_868;
  ulong uStack_860;
  undefined8 *local_850;
  float *local_848;
  float *local_840;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  undefined8 local_828;
  undefined8 uStack_820;
  float local_818 [2];
  float afStack_810 [2];
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 *local_7f0;
  float *local_7e8;
  float *local_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  float local_7b8 [2];
  float afStack_7b0 [2];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 *local_790;
  float *local_788;
  float *local_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  float local_758 [2];
  float afStack_750 [2];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 *local_730;
  float *local_728;
  float *local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_6f8 [2];
  float afStack_6f0 [2];
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 *local_6d0;
  float *local_6c8;
  float *local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_698 [2];
  float afStack_690 [2];
  undefined8 local_688;
  undefined8 uStack_680;
  float *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  float local_658 [2];
  float afStack_650 [2];
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  float *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  float local_5f8 [2];
  float afStack_5f0 [2];
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  float *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  float local_598 [2];
  float afStack_590 [2];
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  float local_538 [2];
  float afStack_530 [2];
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  float *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  float local_4d8 [2];
  float afStack_4d0 [2];
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  float *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_478 [2];
  float afStack_470 [2];
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  float *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  float local_418 [2];
  float afStack_410 [2];
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  float *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  float local_3b8 [2];
  float afStack_3b0 [2];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  float *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  float local_2f8 [2];
  float afStack_2f0 [2];
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  float local_298 [2];
  float afStack_290 [2];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  float local_238 [2];
  float afStack_230 [2];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  float local_1d8 [2];
  float afStack_1d0 [2];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  float local_178 [2];
  float afStack_170 [2];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 (*local_18) [16];
  float *local_10;
  undefined1 *local_8;
  
  local_d50 = *in_RDI;
  local_d54 = 0;
  if (in_R8D == 4) {
    local_d98 = *(undefined8 *)in_RDI;
    uStack_d90 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_d98 = CONCAT44(local_d50,local_d50);
    uStack_d90 = CONCAT44(local_d50,local_d50);
    local_cf8 = local_d50;
    fStack_cf4 = local_d50;
    fStack_cf0 = local_d50;
    fStack_cec = local_d50;
    local_ce8 = local_d50;
  }
  local_d68 = local_d98;
  uStack_d60 = uStack_d90;
  local_d40 = in_RDX;
  local_d38 = in_RSI;
  for (; local_d44 = in_ECX, local_d54 + 3 < in_ECX; local_d54 = local_d54 + 4) {
    local_d28 = local_d38;
    local_d78 = *(undefined8 *)*local_d38;
    uStack_d70 = *(undefined8 *)(*local_d38 + 8);
    local_cd0 = local_d49;
    local_cd8 = &local_d68;
    puStack_ce0 = &local_d78;
    local_cc8 = local_d98;
    uStack_cc0 = uStack_d90;
    local_c58 = 0x3f8000003f800000;
    uStack_c50 = 0x3f8000003f800000;
    local_958 = 0;
    uStack_950 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8._0_4_ = (float)local_d78;
    local_d8._4_4_ = (float)((ulong)local_d78 >> 0x20);
    uStack_d0._0_4_ = (float)uStack_d70;
    uStack_d0._4_4_ = (float)((ulong)uStack_d70 >> 0x20);
    local_ab8 = -(uint)((float)local_d8 <= 0.0);
    iStack_ab4 = -(uint)(local_d8._4_4_ <= 0.0);
    iStack_ab0 = -(uint)((float)uStack_d0 <= 0.0);
    iStack_aac = -(uint)(uStack_d0._4_4_ <= 0.0);
    local_978 = 0x80000000800000;
    uStack_970 = 0x80000000800000;
    auVar6._8_8_ = 0x80000000800000;
    auVar6._0_8_ = 0x80000000800000;
    auVar8 = maxps(*local_d38,auVar6);
    local_a88 = auVar8._0_8_;
    local_a8 = local_a88;
    uStack_a80 = auVar8._8_8_;
    uStack_a0 = uStack_a80;
    uVar1 = local_a88;
    uVar2 = uStack_a80;
    local_bc = 0x17;
    local_b8._0_4_ = auVar8._0_4_;
    local_b8._4_4_ = auVar8._4_4_;
    uStack_b0._0_4_ = auVar8._8_4_;
    uStack_b0._4_4_ = auVar8._12_4_;
    local_888 = local_a88;
    uStack_880 = uStack_a80;
    local_898 = 0x807fffff807fffff;
    uStack_890 = 0x807fffff807fffff;
    local_68 = local_a88 & 0x807fffff807fffff;
    uStack_60 = uStack_a80 & 0x807fffff807fffff;
    local_be8 = 0x3f0000003f000000;
    uStack_be0 = 0x3f0000003f000000;
    local_9e8 = local_68 | 0x3f0000003f000000;
    uStack_9e0 = uStack_60 | 0x3f0000003f000000;
    local_48 = CONCAT44(local_b8._4_4_ >> 0x17,(uint)local_b8 >> 0x17);
    uStack_40 = CONCAT44(uStack_b0._4_4_ >> 0x17,(uint)uStack_b0 >> 0x17);
    local_138 = 0x7f0000007f;
    uStack_130 = 0x7f0000007f;
    local_a98 = ((uint)local_b8 >> 0x17) - 0x7f;
    iStack_a94 = (local_b8._4_4_ >> 0x17) - 0x7f;
    iStack_a90 = ((uint)uStack_b0 >> 0x17) - 0x7f;
    iStack_a8c = (uStack_b0._4_4_ >> 0x17) - 0x7f;
    local_918 = CONCAT44(iStack_a94,local_a98);
    uStack_910 = CONCAT44(iStack_a8c,iStack_a90);
    local_a28 = CONCAT44((float)iStack_a94,(float)local_a98);
    uStack_a20 = CONCAT44((float)iStack_a8c,(float)iStack_a90);
    local_a38 = 0x3f8000003f800000;
    uStack_a30 = 0x3f8000003f800000;
    local_ac8 = (float)local_a98 + 1.0;
    fStack_ac4 = (float)iStack_a94 + 1.0;
    fStack_ac0 = (float)iStack_a90 + 1.0;
    fStack_abc = (float)iStack_a8c + 1.0;
    local_38 = 0x3f3504f33f3504f3;
    uStack_30 = 0x3f3504f33f3504f3;
    local_28._0_4_ = (float)local_9e8;
    local_28._4_4_ = (float)(local_9e8 >> 0x20);
    uStack_20._0_4_ = (float)uStack_9e0;
    uStack_20._4_4_ = (float)(uStack_9e0 >> 0x20);
    local_ad8 = -(uint)((float)local_28 < 0.70710677);
    iStack_ad4 = -(uint)(local_28._4_4_ < 0.70710677);
    iStack_ad0 = -(uint)((float)uStack_20 < 0.70710677);
    iStack_acc = -(uint)(uStack_20._4_4_ < 0.70710677);
    local_8b8 = CONCAT44(iStack_ad4,local_ad8);
    uStack_8b0 = CONCAT44(iStack_acc,iStack_ad0);
    local_ae8 = local_9e8 & local_8b8;
    uStack_ae0 = uStack_9e0 & uStack_8b0;
    local_9f8 = 0x3f8000003f800000;
    uStack_9f0 = 0x3f8000003f800000;
    local_a88 = CONCAT44(local_28._4_4_ - 1.0,(float)local_28 - 1.0);
    uStack_a80._0_4_ = (float)uStack_20 - 1.0;
    uStack_a80._4_4_ = uStack_20._4_4_ - 1.0;
    local_a08 = CONCAT44(fStack_ac4,local_ac8);
    uStack_a00 = CONCAT44(fStack_abc,fStack_ac0);
    local_8c8 = 0x3f8000003f800000;
    uStack_8c0 = 0x3f8000003f800000;
    local_8d8 = CONCAT44(iStack_ad4,local_ad8);
    uStack_8d0 = CONCAT44(iStack_acc,iStack_ad0);
    uVar11 = local_8d8 & 0x3f8000003f800000;
    uVar14 = uStack_8d0 & 0x3f8000003f800000;
    local_a18._0_4_ = (float)uVar11;
    local_a18._4_4_ = (float)(uVar11 >> 0x20);
    uStack_a10._0_4_ = (float)uVar14;
    uStack_a10._4_4_ = (float)(uVar14 >> 0x20);
    local_ac8 = local_ac8 - (float)local_a18;
    fStack_ac4 = fStack_ac4 - local_a18._4_4_;
    fStack_ac0 = fStack_ac0 - (float)uStack_a10;
    fStack_abc = fStack_abc - uStack_a10._4_4_;
    local_a48 = local_a88;
    uStack_a40 = uStack_a80;
    local_a58._0_4_ = (float)local_ae8;
    local_a58._4_4_ = (float)(local_ae8 >> 0x20);
    uStack_a50._0_4_ = (float)uStack_ae0;
    uStack_a50._4_4_ = (float)(uStack_ae0 >> 0x20);
    local_a58._0_4_ = ((float)local_28 - 1.0) + (float)local_a58;
    local_a58._4_4_ = (local_28._4_4_ - 1.0) + local_a58._4_4_;
    uStack_a50._0_4_ = ((float)uStack_20 - 1.0) + (float)uStack_a50;
    uStack_a50._4_4_ = (uStack_20._4_4_ - 1.0) + uStack_a50._4_4_;
    local_a88 = CONCAT44(local_a58._4_4_,(float)local_a58);
    uStack_a80._0_4_ = (float)uStack_a50;
    uStack_a80._4_4_ = uStack_a50._4_4_;
    local_998 = local_a88;
    uStack_990 = uStack_a80;
    local_af8 = (float)local_a58 * (float)local_a58;
    fStack_af4 = local_a58._4_4_ * local_a58._4_4_;
    fStack_af0 = (float)uStack_a50 * (float)uStack_a50;
    fStack_aec = uStack_a50._4_4_ * uStack_a50._4_4_;
    local_850 = &local_b08;
    local_730 = &local_a88;
    local_3d0 = ::_ps_cephes_log_p1;
    local_388 = 0x3d9021bb3d9021bb;
    uStack_380 = 0x3d9021bb3d9021bb;
    local_398 = local_a88;
    uStack_390 = uStack_a80;
    local_3a8 = (float)local_a58 * 0.070376836;
    fStack_3a4 = local_a58._4_4_ * 0.070376836;
    fStack_3a0 = (float)uStack_a50 * 0.070376836;
    fStack_39c = uStack_a50._4_4_ * 0.070376836;
    local_3b8[0] = -0.1151461;
    local_3b8[1] = -0.1151461;
    afStack_3b0[0] = -0.1151461;
    afStack_3b0[1] = -0.1151461;
    local_b08 = CONCAT44(fStack_3a4 + -0.1151461,local_3a8 + -0.1151461);
    uStack_b00 = CONCAT44(fStack_39c + -0.1151461,fStack_3a0 + -0.1151461);
    local_430 = ::_ps_cephes_log_p2;
    local_3e8 = local_b08;
    uStack_3e0 = uStack_b00;
    local_3f8 = local_a88;
    uStack_3f0 = uStack_a80;
    local_408 = (local_3a8 + -0.1151461) * (float)local_a58;
    fStack_404 = (fStack_3a4 + -0.1151461) * local_a58._4_4_;
    fStack_400 = (fStack_3a0 + -0.1151461) * (float)uStack_a50;
    fStack_3fc = (fStack_39c + -0.1151461) * uStack_a50._4_4_;
    local_418[0] = 0.116769984;
    local_418[1] = 0.116769984;
    afStack_410[0] = 0.116769984;
    afStack_410[1] = 0.116769984;
    local_b08 = CONCAT44(fStack_404 + 0.116769984,local_408 + 0.116769984);
    uStack_b00 = CONCAT44(fStack_3fc + 0.116769984,fStack_400 + 0.116769984);
    local_490 = ::_ps_cephes_log_p3;
    local_448 = local_b08;
    uStack_440 = uStack_b00;
    local_458 = local_a88;
    uStack_450 = uStack_a80;
    local_468 = (local_408 + 0.116769984) * (float)local_a58;
    fStack_464 = (fStack_404 + 0.116769984) * local_a58._4_4_;
    fStack_460 = (fStack_400 + 0.116769984) * (float)uStack_a50;
    fStack_45c = (fStack_3fc + 0.116769984) * uStack_a50._4_4_;
    local_478[0] = -0.12420141;
    local_478[1] = -0.12420141;
    afStack_470[0] = -0.12420141;
    afStack_470[1] = -0.12420141;
    local_b08 = CONCAT44(fStack_464 + -0.12420141,local_468 + -0.12420141);
    uStack_b00 = CONCAT44(fStack_45c + -0.12420141,fStack_460 + -0.12420141);
    local_4f0 = ::_ps_cephes_log_p4;
    local_4a8 = local_b08;
    uStack_4a0 = uStack_b00;
    local_4b8 = local_a88;
    uStack_4b0 = uStack_a80;
    local_4c8 = (local_468 + -0.12420141) * (float)local_a58;
    fStack_4c4 = (fStack_464 + -0.12420141) * local_a58._4_4_;
    fStack_4c0 = (fStack_460 + -0.12420141) * (float)uStack_a50;
    fStack_4bc = (fStack_45c + -0.12420141) * uStack_a50._4_4_;
    local_4d8[0] = 0.14249323;
    local_4d8[1] = 0.14249323;
    afStack_4d0[0] = 0.14249323;
    afStack_4d0[1] = 0.14249323;
    local_b08 = CONCAT44(fStack_4c4 + 0.14249323,local_4c8 + 0.14249323);
    uStack_b00 = CONCAT44(fStack_4bc + 0.14249323,fStack_4c0 + 0.14249323);
    local_550 = ::_ps_cephes_log_p5;
    local_508 = local_b08;
    uStack_500 = uStack_b00;
    local_518 = local_a88;
    uStack_510 = uStack_a80;
    local_528 = (local_4c8 + 0.14249323) * (float)local_a58;
    fStack_524 = (fStack_4c4 + 0.14249323) * local_a58._4_4_;
    fStack_520 = (fStack_4c0 + 0.14249323) * (float)uStack_a50;
    fStack_51c = (fStack_4bc + 0.14249323) * uStack_a50._4_4_;
    local_538[0] = -0.16668057;
    local_538[1] = -0.16668057;
    afStack_530[0] = -0.16668057;
    afStack_530[1] = -0.16668057;
    local_b08 = CONCAT44(fStack_524 + -0.16668057,local_528 + -0.16668057);
    uStack_b00 = CONCAT44(fStack_51c + -0.16668057,fStack_520 + -0.16668057);
    local_5b0 = ::_ps_cephes_log_p6;
    local_568 = local_b08;
    uStack_560 = uStack_b00;
    local_578 = local_a88;
    uStack_570 = uStack_a80;
    local_588 = (local_528 + -0.16668057) * (float)local_a58;
    fStack_584 = (fStack_524 + -0.16668057) * local_a58._4_4_;
    fStack_580 = (fStack_520 + -0.16668057) * (float)uStack_a50;
    fStack_57c = (fStack_51c + -0.16668057) * uStack_a50._4_4_;
    local_598[0] = 0.20000714;
    local_598[1] = 0.20000714;
    afStack_590[0] = 0.20000714;
    afStack_590[1] = 0.20000714;
    local_b08 = CONCAT44(fStack_584 + 0.20000714,local_588 + 0.20000714);
    uStack_b00 = CONCAT44(fStack_57c + 0.20000714,fStack_580 + 0.20000714);
    local_610 = ::_ps_cephes_log_p7;
    local_5c8 = local_b08;
    uStack_5c0 = uStack_b00;
    local_5d8 = local_a88;
    uStack_5d0 = uStack_a80;
    local_5e8 = (local_588 + 0.20000714) * (float)local_a58;
    fStack_5e4 = (fStack_584 + 0.20000714) * local_a58._4_4_;
    fStack_5e0 = (fStack_580 + 0.20000714) * (float)uStack_a50;
    fStack_5dc = (fStack_57c + 0.20000714) * uStack_a50._4_4_;
    local_5f8[0] = -0.24999994;
    local_5f8[1] = -0.24999994;
    afStack_5f0[0] = -0.24999994;
    afStack_5f0[1] = -0.24999994;
    local_b08 = CONCAT44(fStack_5e4 + -0.24999994,local_5e8 + -0.24999994);
    uStack_b00 = CONCAT44(fStack_5dc + -0.24999994,fStack_5e0 + -0.24999994);
    local_670 = ::_ps_cephes_log_p8;
    local_628 = local_b08;
    uStack_620 = uStack_b00;
    local_638 = local_a88;
    uStack_630 = uStack_a80;
    local_648 = (local_5e8 + -0.24999994) * (float)local_a58;
    fStack_644 = (fStack_5e4 + -0.24999994) * local_a58._4_4_;
    fStack_640 = (fStack_5e0 + -0.24999994) * (float)uStack_a50;
    fStack_63c = (fStack_5dc + -0.24999994) * uStack_a50._4_4_;
    local_658[0] = 0.3333333;
    local_658[1] = 0.3333333;
    afStack_650[0] = 0.3333333;
    afStack_650[1] = 0.3333333;
    local_b08 = CONCAT44(fStack_644 + 0.3333333,local_648 + 0.3333333);
    uStack_b00 = CONCAT44(fStack_63c + 0.3333333,fStack_640 + 0.3333333);
    local_9a8 = local_b08;
    uStack_9a0 = uStack_b00;
    local_9b8 = local_a88;
    uStack_9b0 = uStack_a80;
    fVar10 = (local_648 + 0.3333333) * (float)local_a58;
    fVar12 = (fStack_644 + 0.3333333) * local_a58._4_4_;
    fVar13 = (fStack_640 + 0.3333333) * (float)uStack_a50;
    fVar15 = (fStack_63c + 0.3333333) * uStack_a50._4_4_;
    local_b08 = CONCAT44(fVar12,fVar10);
    uStack_b00 = CONCAT44(fVar15,fVar13);
    local_9c8 = local_b08;
    uStack_9c0 = uStack_b00;
    local_9d8 = CONCAT44(fStack_af4,local_af8);
    uStack_9d0 = CONCAT44(fStack_aec,fStack_af0);
    fVar10 = fVar10 * local_af8;
    fVar12 = fVar12 * fStack_af4;
    fVar13 = fVar13 * fStack_af0;
    fVar15 = fVar15 * fStack_aec;
    local_b08 = CONCAT44(fVar12,fVar10);
    uStack_b00 = CONCAT44(fVar15,fVar13);
    local_720 = &local_ac8;
    local_6c8 = ::_ps_cephes_log_q1;
    local_688 = CONCAT44(fStack_ac4,local_ac8);
    uStack_680 = CONCAT44(fStack_abc,fStack_ac0);
    local_698[0] = -0.00021219444;
    local_698[1] = -0.00021219444;
    afStack_690[0] = -0.00021219444;
    afStack_690[1] = -0.00021219444;
    local_6a8 = local_ac8 * -0.00021219444;
    fStack_6a4 = fStack_ac4 * -0.00021219444;
    fStack_6a0 = fStack_ac0 * -0.00021219444;
    fStack_69c = fStack_abc * -0.00021219444;
    local_6b8 = local_b08;
    uStack_6b0 = uStack_b00;
    fVar10 = local_6a8 + fVar10;
    fVar12 = fStack_6a4 + fVar12;
    fVar13 = fStack_6a0 + fVar13;
    fVar15 = fStack_69c + fVar15;
    local_b08 = CONCAT44(fVar12,fVar10);
    uStack_b00 = CONCAT44(fVar15,fVar13);
    local_840 = &local_af8;
    local_848 = ::_ps_0p5;
    local_828 = local_b08;
    uStack_820 = uStack_b00;
    local_808 = CONCAT44(fStack_af4,local_af8);
    uStack_800 = CONCAT44(fStack_aec,fStack_af0);
    local_818[0] = 0.5;
    local_818[1] = 0.5;
    afStack_810[0] = 0.5;
    afStack_810[1] = 0.5;
    local_838 = local_af8 * 0.5;
    fStack_834 = fStack_af4 * 0.5;
    fStack_830 = fStack_af0 * 0.5;
    fStack_82c = fStack_aec * 0.5;
    fVar10 = fVar10 - local_838;
    fVar12 = fVar12 - fStack_834;
    fVar13 = fVar13 - fStack_830;
    fVar15 = fVar15 - fStack_82c;
    local_b08 = CONCAT44(fVar12,fVar10);
    uStack_b00 = CONCAT44(fVar15,fVar13);
    local_a68 = local_a88;
    uStack_a60 = uStack_a80;
    local_a78 = local_b08;
    uStack_a70 = uStack_b00;
    local_a58._0_4_ = (float)local_a58 + fVar10;
    local_a58._4_4_ = local_a58._4_4_ + fVar12;
    uStack_a50._0_4_ = (float)uStack_a50 + fVar13;
    uStack_a50._4_4_ = uStack_a50._4_4_ + fVar15;
    local_a88 = CONCAT44(local_a58._4_4_,(float)local_a58);
    uStack_a80._0_4_ = (float)uStack_a50;
    uStack_a80._4_4_ = uStack_a50._4_4_;
    local_728 = ::_ps_cephes_log_q2;
    local_6e8 = CONCAT44(fStack_ac4,local_ac8);
    uStack_6e0 = CONCAT44(fStack_abc,fStack_ac0);
    local_6f8[0] = 0.6933594;
    local_6f8[1] = 0.6933594;
    afStack_6f0[0] = 0.6933594;
    afStack_6f0[1] = 0.6933594;
    local_708 = local_ac8 * 0.6933594;
    fStack_704 = fStack_ac4 * 0.6933594;
    fStack_700 = fStack_ac0 * 0.6933594;
    fStack_6fc = fStack_abc * 0.6933594;
    local_718 = local_a88;
    uStack_710 = uStack_a80;
    local_a88 = CONCAT44(fStack_704 + local_a58._4_4_,local_708 + (float)local_a58);
    uStack_a80._0_4_ = fStack_700 + (float)uStack_a50;
    uStack_a80._4_4_ = fStack_6fc + uStack_a50._4_4_;
    local_88 = local_a88;
    uStack_80 = uStack_a80;
    local_98 = CONCAT44(iStack_ab4,local_ab8);
    uStack_90 = CONCAT44(iStack_aac,iStack_ab0);
    local_a88 = local_a88 | local_98;
    uStack_a80 = uStack_a80 | uStack_90;
    local_c98._0_4_ = (float)local_d98;
    local_c98._4_4_ = (float)((ulong)local_d98 >> 0x20);
    uStack_c90._0_4_ = (float)uStack_d90;
    uStack_c90._4_4_ = (float)((ulong)uStack_d90 >> 0x20);
    local_ca8._0_4_ = (float)local_a88;
    local_ca8._4_4_ = (float)(local_a88 >> 0x20);
    uStack_ca0._0_4_ = (float)uStack_a80;
    uStack_ca0._4_4_ = (float)(uStack_a80 >> 0x20);
    local_c18 = CONCAT44(local_c98._4_4_ * local_ca8._4_4_,(float)local_c98 * (float)local_ca8);
    uStack_c10._0_4_ = (float)uStack_c90 * (float)uStack_ca0;
    uStack_c10._4_4_ = uStack_c90._4_4_ * uStack_ca0._4_4_;
    local_948 = 0;
    uStack_940 = 0;
    local_b18 = local_c18;
    uStack_b10 = uStack_c10;
    local_b28 = 0x42b0c0a542b0c0a5;
    uStack_b20 = 0x42b0c0a542b0c0a5;
    auVar5._8_8_ = uStack_c10;
    auVar5._0_8_ = local_c18;
    auVar9._8_8_ = 0x42b0c0a542b0c0a5;
    auVar9._0_8_ = 0x42b0c0a542b0c0a5;
    auVar9 = minps(auVar5,auVar9);
    local_c18 = auVar9._0_8_;
    local_b38 = local_c18;
    uStack_c10 = auVar9._8_8_;
    uStack_b30 = uStack_c10;
    local_b48 = 0xc2b0c0a5c2b0c0a5;
    uStack_b40 = 0xc2b0c0a5c2b0c0a5;
    auVar8._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar8._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar8 = maxps(auVar9,auVar8);
    local_c18 = auVar8._0_8_;
    uVar3 = local_c18;
    uStack_c10 = auVar8._8_8_;
    uVar4 = uStack_c10;
    local_b68 = 0x3fb8aa3b3fb8aa3b;
    uStack_b60 = 0x3fb8aa3b3fb8aa3b;
    local_b58._0_4_ = auVar8._0_4_;
    local_b58._4_4_ = auVar8._4_4_;
    uStack_b50._0_4_ = auVar8._8_4_;
    uStack_b50._4_4_ = auVar8._12_4_;
    local_bd8 = CONCAT44(local_b58._4_4_ * 1.442695,(float)local_b58 * 1.442695);
    uStack_bd0 = CONCAT44(uStack_b50._4_4_ * 1.442695,(float)uStack_b50 * 1.442695);
    fVar10 = (float)local_b58 * 1.442695 + 0.5;
    fVar12 = local_b58._4_4_ * 1.442695 + 0.5;
    fVar13 = (float)uStack_b50 * 1.442695 + 0.5;
    fVar15 = uStack_b50._4_4_ * 1.442695 + 0.5;
    local_928 = CONCAT44(fVar12,fVar10);
    uStack_920 = CONCAT44(fVar15,fVar13);
    local_908 = CONCAT44((int)fVar12,(int)fVar10);
    uStack_900 = CONCAT44((int)fVar15,(int)fVar13);
    local_c38 = (float)(int)fVar10;
    fStack_c34 = (float)(int)fVar12;
    fStack_c30 = (float)(int)fVar13;
    fStack_c2c = (float)(int)fVar15;
    local_c28 = CONCAT44(fStack_c34,local_c38);
    uStack_c20 = CONCAT44(fStack_c2c,fStack_c30);
    local_8e8 = local_c28;
    uStack_8e0 = uStack_c20;
    local_8f8 = CONCAT44(fVar12,fVar10);
    uStack_8f0 = CONCAT44(fVar15,fVar13);
    local_c68 = CONCAT44(-(uint)(fVar12 < fStack_c34),-(uint)(fVar10 < local_c38));
    uStack_c60 = CONCAT44(-(uint)(fVar15 < fStack_c2c),-(uint)(fVar13 < fStack_c30));
    local_868 = local_c68;
    uStack_860 = uStack_c60;
    local_878 = 0x3f8000003f800000;
    uStack_870 = 0x3f8000003f800000;
    local_c68 = local_c68 & 0x3f8000003f800000;
    uStack_c60 = uStack_c60 & 0x3f8000003f800000;
    local_bb8 = local_c28;
    uStack_bb0 = uStack_c20;
    local_bc8._0_4_ = (float)local_c68;
    local_bc8._4_4_ = (float)(local_c68 >> 0x20);
    uStack_bc0._0_4_ = (float)uStack_c60;
    uStack_bc0._4_4_ = (float)(uStack_c60 >> 0x20);
    local_c38 = local_c38 - (float)local_bc8;
    fStack_c34 = fStack_c34 - local_bc8._4_4_;
    fStack_c30 = fStack_c30 - (float)uStack_bc0;
    fStack_c2c = fStack_c2c - uStack_bc0._4_4_;
    local_7e0 = &local_c38;
    local_788 = ::_ps_cephes_exp_C1;
    local_7f0 = &local_c18;
    local_768 = local_c18;
    uStack_760 = uStack_c10;
    local_748 = CONCAT44(fStack_c34,local_c38);
    uStack_740 = CONCAT44(fStack_c2c,fStack_c30);
    local_758[0] = 0.6933594;
    local_758[1] = 0.6933594;
    afStack_750[0] = 0.6933594;
    afStack_750[1] = 0.6933594;
    local_778 = local_c38 * 0.6933594;
    fStack_774 = fStack_c34 * 0.6933594;
    fStack_770 = fStack_c30 * 0.6933594;
    fStack_76c = fStack_c2c * 0.6933594;
    local_c18 = CONCAT44(local_b58._4_4_ - fStack_774,(float)local_b58 - local_778);
    uStack_c10._0_4_ = (float)uStack_b50 - fStack_770;
    uStack_c10._4_4_ = uStack_b50._4_4_ - fStack_76c;
    local_7e8 = ::_ps_cephes_exp_C2;
    local_7c8 = local_c18;
    uStack_7c0 = uStack_c10;
    local_7a8 = CONCAT44(fStack_c34,local_c38);
    uStack_7a0 = CONCAT44(fStack_c2c,fStack_c30);
    local_7b8[0] = -0.00021219444;
    local_7b8[1] = -0.00021219444;
    afStack_7b0[0] = -0.00021219444;
    afStack_7b0[1] = -0.00021219444;
    local_7d8 = local_c38 * -0.00021219444;
    fStack_7d4 = fStack_c34 * -0.00021219444;
    fStack_7d0 = fStack_c30 * -0.00021219444;
    fStack_7cc = fStack_c2c * -0.00021219444;
    fVar10 = ((float)local_b58 - local_778) - local_7d8;
    fVar12 = (local_b58._4_4_ - fStack_774) - fStack_7d4;
    fVar13 = ((float)uStack_b50 - fStack_770) - fStack_7d0;
    fVar15 = (uStack_b50._4_4_ - fStack_76c) - fStack_7cc;
    local_c18 = CONCAT44(fVar12,fVar10);
    uStack_c10._0_4_ = fVar13;
    uStack_c10._4_4_ = fVar15;
    local_b88 = local_c18;
    uStack_b80 = uStack_c10;
    local_c28 = CONCAT44(fVar12 * fVar12,fVar10 * fVar10);
    uStack_c20 = CONCAT44(fVar15 * fVar15,fVar13 * fVar13);
    local_360 = &local_c78;
    local_190 = ::_ps_cephes_exp_p1;
    local_148 = 0x3950696739506967;
    uStack_140 = 0x3950696739506967;
    local_158 = local_c18;
    uStack_150 = uStack_c10;
    local_168 = fVar10 * 0.00019875691;
    fStack_164 = fVar12 * 0.00019875691;
    fStack_160 = fVar13 * 0.00019875691;
    fStack_15c = fVar15 * 0.00019875691;
    local_178[0] = 0.0013981999;
    local_178[1] = 0.0013981999;
    afStack_170[0] = 0.0013981999;
    afStack_170[1] = 0.0013981999;
    local_c78 = CONCAT44(fStack_164 + 0.0013981999,local_168 + 0.0013981999);
    uStack_c70 = CONCAT44(fStack_15c + 0.0013981999,fStack_160 + 0.0013981999);
    local_1f0 = ::_ps_cephes_exp_p2;
    local_1a8 = local_c78;
    uStack_1a0 = uStack_c70;
    local_1b8 = local_c18;
    uStack_1b0 = uStack_c10;
    local_1c8 = (local_168 + 0.0013981999) * fVar10;
    fStack_1c4 = (fStack_164 + 0.0013981999) * fVar12;
    fStack_1c0 = (fStack_160 + 0.0013981999) * fVar13;
    fStack_1bc = (fStack_15c + 0.0013981999) * fVar15;
    local_1d8[0] = 0.008333452;
    local_1d8[1] = 0.008333452;
    afStack_1d0[0] = 0.008333452;
    afStack_1d0[1] = 0.008333452;
    local_c78 = CONCAT44(fStack_1c4 + 0.008333452,local_1c8 + 0.008333452);
    uStack_c70 = CONCAT44(fStack_1bc + 0.008333452,fStack_1c0 + 0.008333452);
    local_250 = ::_ps_cephes_exp_p3;
    local_208 = local_c78;
    uStack_200 = uStack_c70;
    local_218 = local_c18;
    uStack_210 = uStack_c10;
    local_228 = (local_1c8 + 0.008333452) * fVar10;
    fStack_224 = (fStack_1c4 + 0.008333452) * fVar12;
    fStack_220 = (fStack_1c0 + 0.008333452) * fVar13;
    fStack_21c = (fStack_1bc + 0.008333452) * fVar15;
    local_238[0] = 0.041665796;
    local_238[1] = 0.041665796;
    afStack_230[0] = 0.041665796;
    afStack_230[1] = 0.041665796;
    local_c78 = CONCAT44(fStack_224 + 0.041665796,local_228 + 0.041665796);
    uStack_c70 = CONCAT44(fStack_21c + 0.041665796,fStack_220 + 0.041665796);
    local_2b0 = ::_ps_cephes_exp_p4;
    local_268 = local_c78;
    uStack_260 = uStack_c70;
    local_278 = local_c18;
    uStack_270 = uStack_c10;
    local_288 = (local_228 + 0.041665796) * fVar10;
    fStack_284 = (fStack_224 + 0.041665796) * fVar12;
    fStack_280 = (fStack_220 + 0.041665796) * fVar13;
    fStack_27c = (fStack_21c + 0.041665796) * fVar15;
    local_298[0] = 0.16666666;
    local_298[1] = 0.16666666;
    afStack_290[0] = 0.16666666;
    afStack_290[1] = 0.16666666;
    local_c78 = CONCAT44(fStack_284 + 0.16666666,local_288 + 0.16666666);
    uStack_c70 = CONCAT44(fStack_27c + 0.16666666,fStack_280 + 0.16666666);
    local_310 = ::_ps_cephes_exp_p5;
    local_2c8 = local_c78;
    uStack_2c0 = uStack_c70;
    local_2d8 = local_c18;
    uStack_2d0 = uStack_c10;
    local_2e8 = (local_288 + 0.16666666) * fVar10;
    fStack_2e4 = (fStack_284 + 0.16666666) * fVar12;
    fStack_2e0 = (fStack_280 + 0.16666666) * fVar13;
    fStack_2dc = (fStack_27c + 0.16666666) * fVar15;
    local_2f8[0] = 0.5;
    local_2f8[1] = 0.5;
    afStack_2f0[0] = 0.5;
    afStack_2f0[1] = 0.5;
    local_c78 = CONCAT44(fStack_2e4 + 0.5,local_2e8 + 0.5);
    uStack_c70 = CONCAT44(fStack_2dc + 0.5,fStack_2e0 + 0.5);
    local_368 = &local_c28;
    local_328 = local_c78;
    uStack_320 = uStack_c70;
    local_338 = local_c28;
    uStack_330 = uStack_c20;
    local_348 = (local_2e8 + 0.5) * fVar10 * fVar10;
    fStack_344 = (fStack_2e4 + 0.5) * fVar12 * fVar12;
    fStack_340 = (fStack_2e0 + 0.5) * fVar13 * fVar13;
    fStack_33c = (fStack_2dc + 0.5) * fVar15 * fVar15;
    local_358 = local_c18;
    uStack_350 = uStack_c10;
    local_c78 = CONCAT44(fStack_344 + fVar12,local_348 + fVar10);
    uStack_c70 = CONCAT44(fStack_33c + fVar15,fStack_340 + fVar13);
    local_bf8 = local_c78;
    uStack_bf0 = uStack_c70;
    local_c08 = 0x3f8000003f800000;
    uStack_c00 = 0x3f8000003f800000;
    fVar10 = local_348 + fVar10 + 1.0;
    fVar12 = fStack_344 + fVar12 + 1.0;
    fVar13 = fStack_340 + fVar13 + 1.0;
    fVar15 = fStack_33c + fVar15 + 1.0;
    local_c78 = CONCAT44(fVar12,fVar10);
    uStack_c70 = CONCAT44(fVar15,fVar13);
    local_938 = CONCAT44(fStack_c34,local_c38);
    uStack_930 = CONCAT44(fStack_c2c,fStack_c30);
    local_128 = CONCAT44((int)fStack_c34,(int)local_c38);
    uStack_120 = CONCAT44((int)fStack_c2c,(int)fStack_c30);
    iVar7 = (int)local_c38 + 0x7f;
    fStack_c44 = (float)((int)fStack_c34 + 0x7f);
    fStack_c40 = (float)((int)fStack_c30 + 0x7f);
    fStack_c3c = (float)((int)fStack_c2c + 0x7f);
    local_108 = CONCAT44(fStack_c44,iVar7);
    uStack_100 = CONCAT44(fStack_c3c,fStack_c40);
    local_10c = 0x17;
    local_c48 = (float)(iVar7 * 0x800000);
    local_c88 = CONCAT44(fStack_c44,local_c48);
    uStack_c80 = CONCAT44(fStack_c3c,fStack_c40);
    local_b98 = local_c78;
    uStack_b90 = uStack_c70;
    local_c78 = CONCAT44(fVar12 * fStack_c44,fVar10 * local_c48);
    uStack_c70 = CONCAT44(fVar15 * fStack_c3c,fVar13 * fStack_c40);
    local_d00 = local_d40;
    local_d18 = local_c78;
    uStack_d10 = uStack_c70;
    *(undefined8 *)local_d40 = local_c78;
    *(undefined8 *)(local_d40 + 2) = uStack_c70;
    local_d38 = local_d38 + 1;
    local_d40 = local_d40 + 4;
    local_cb8 = local_d78;
    uStack_cb0 = uStack_d70;
    local_ca8 = local_a88;
    uStack_ca0 = uStack_a80;
    local_c98 = local_cc8;
    uStack_c90 = uStack_cc0;
    local_bc8 = local_c68;
    uStack_bc0 = uStack_c60;
    local_ba8 = local_c88;
    uStack_ba0 = uStack_c80;
    local_b78 = local_b88;
    uStack_b70 = uStack_b80;
    local_b58 = uVar3;
    uStack_b50 = uVar4;
    local_aa8 = local_c58;
    uStack_aa0 = uStack_c50;
    local_a58 = local_ae8;
    uStack_a50 = uStack_ae0;
    local_a18 = uVar11;
    uStack_a10 = uVar14;
    local_988 = local_998;
    uStack_980 = uStack_990;
    local_968 = local_d78;
    uStack_960 = uStack_d70;
    local_8a8 = local_9e8;
    uStack_8a0 = uStack_9e0;
    local_790 = local_7f0;
    local_780 = local_7e0;
    local_6d0 = local_850;
    local_6c0 = local_720;
    local_668 = local_730;
    local_660 = local_850;
    local_608 = local_730;
    local_600 = local_850;
    local_5a8 = local_730;
    local_5a0 = local_850;
    local_548 = local_730;
    local_540 = local_850;
    local_4e8 = local_730;
    local_4e0 = local_850;
    local_488 = local_730;
    local_480 = local_850;
    local_428 = local_730;
    local_420 = local_850;
    local_3c8 = local_730;
    local_3c0 = local_850;
    local_370 = local_7f0;
    local_308 = local_7f0;
    local_300 = local_360;
    local_2a8 = local_7f0;
    local_2a0 = local_360;
    local_248 = local_7f0;
    local_240 = local_360;
    local_1e8 = local_7f0;
    local_1e0 = local_360;
    local_188 = local_7f0;
    local_180 = local_360;
    local_f8 = local_c88;
    uStack_f0 = uStack_c80;
    local_d8 = local_d78;
    uStack_d0 = uStack_d70;
    local_b8 = uVar1;
    uStack_b0 = uVar2;
    local_78 = local_be8;
    uStack_70 = uStack_be0;
    local_58 = local_138;
    uStack_50 = uStack_130;
    local_28 = local_9e8;
    uStack_20 = uStack_9e0;
  }
  for (; local_d54 < local_d44; local_d54 = local_d54 + 1) {
    local_8 = local_d49;
    local_10 = &local_d50;
    local_18 = local_d38;
    fVar10 = powf(*(float *)*local_d38,local_d50);
    *local_d40 = fVar10;
    local_d38 = (undefined1 (*) [16])(*local_d38 + 4);
    local_d40 = local_d40 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}